

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O1

Box<Dims> *
adios2::helper::IntersectionStartCount
          (Box<Dims> *__return_storage_ptr__,Dims *start1,Dims *count1,Dims *start2,Dims *count2)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  iterator iVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  ulong __n;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  size_t intersectionStart;
  ulong local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  Dims *local_58;
  Dims *local_50;
  Dims *local_48;
  Dims *local_40;
  unsigned_long local_38;
  
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (start1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (start1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar2 - (long)puVar1 >> 3;
  bVar15 = puVar2 != puVar1;
  if (puVar2 == puVar1) {
    bVar10 = false;
  }
  else {
    bVar10 = false;
    uVar12 = 1;
    do {
      uVar11 = puVar1[uVar12 - 1];
      uVar3 = (start2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar12 - 1];
      if ((uVar11 + (count1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar12 - 1]) - 1 < uVar3) {
        bVar10 = true;
        bVar9 = false;
      }
      else {
        bVar14 = (uVar3 + (count2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar12 - 1]) - 1 < uVar11;
        bVar9 = !bVar14;
        bVar10 = (bool)(bVar10 | bVar14);
      }
      if (!bVar9) break;
      bVar15 = uVar12 < __n;
      lVar13 = (-(ulong)(__n == 0) - __n) + uVar12;
      uVar12 = uVar12 + 1;
    } while (lVar13 != 0);
  }
  local_48 = start1;
  local_40 = start2;
  if (bVar15) {
    if (!bVar10) {
      puVar1 = (__return_storage_ptr__->second).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
      puVar1 = (__return_storage_ptr__->first).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar1 != (pointer)0x0) {
        operator_delete(puVar1);
      }
    }
  }
  else {
    local_58 = count1;
    local_50 = count2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&__return_storage_ptr__->first,__n);
    local_60 = &__return_storage_ptr__->second;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_60,__n);
    if (puVar2 != puVar1) {
      lVar13 = 0;
      do {
        puVar1 = (local_48->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar12 = puVar1[lVar13];
        puVar2 = (local_40->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_68 = puVar2[lVar13];
        if (local_68 < uVar12) {
          local_68 = uVar12;
        }
        uVar4 = puVar1[lVar13];
        uVar5 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar13];
        uVar6 = puVar2[lVar13];
        uVar7 = (local_50->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar13];
        iVar8._M_current =
             (__return_storage_ptr__->first).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->first).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                     iVar8,&local_68);
        }
        else {
          *iVar8._M_current = local_68;
          (__return_storage_ptr__->first).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        uVar12 = (uVar7 - 1) + uVar6;
        uVar11 = (uVar4 + uVar5) - 1;
        if (uVar11 < uVar12) {
          uVar12 = uVar11;
        }
        local_38 = (uVar12 - local_68) + 1;
        iVar8._M_current =
             (__return_storage_ptr__->second).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (__return_storage_ptr__->second).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>(local_60,iVar8,&local_38);
        }
        else {
          *iVar8._M_current = local_38;
          (__return_storage_ptr__->second).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        lVar13 = lVar13 + 1;
      } while (__n + (__n == 0) != lVar13);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Box<Dims> IntersectionStartCount(const Dims &start1, const Dims &count1, const Dims &start2,
                                 const Dims &count2) noexcept
{
    Box<Dims> intersectionStartCount;
    const size_t dimensionsSize = start1.size();

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        // Don't intercept
        const size_t end1 = start1[d] + count1[d] - 1;
        const size_t end2 = start2[d] + count2[d] - 1;

        if (start2[d] > end1 || end2 < start1[d])
        {
            return intersectionStartCount;
        }
    }

    intersectionStartCount.first.reserve(dimensionsSize);
    intersectionStartCount.second.reserve(dimensionsSize);

    for (size_t d = 0; d < dimensionsSize; ++d)
    {
        const size_t intersectionStart = (start1[d] < start2[d]) ? start2[d] : start1[d];

        // end, must be inclusive
        const size_t end1 = start1[d] + count1[d] - 1;
        const size_t end2 = start2[d] + count2[d] - 1;
        const size_t intersectionEnd = (end1 > end2) ? end2 : end1;

        intersectionStartCount.first.push_back(intersectionStart);
        intersectionStartCount.second.push_back(intersectionEnd - intersectionStart + 1);
    }

    return intersectionStartCount;
}